

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__getpwuid_r(uv_passwd_t *pwd,uid_t uid)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *__buffer;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  size_t sVar6;
  passwd *result;
  passwd pw;
  
  if (pwd == (uv_passwd_t *)0x0) {
    return -0x16;
  }
  sVar6 = 2000;
  do {
    __buffer = (char *)uv__malloc(sVar6);
    if (__buffer == (char *)0x0) goto LAB_001b335b;
    do {
      iVar2 = getpwuid_r(uid,(passwd *)&pw,__buffer,sVar6,(passwd **)&result);
    } while (iVar2 == 4);
    if ((iVar2 == 0) && (result != (passwd *)0x0)) goto LAB_001b3290;
    uv__free(__buffer);
    sVar6 = sVar6 * 2;
  } while (iVar2 == 0x22);
  if (iVar2 == 0) {
    if (result == (passwd *)0x0) {
      iVar2 = -2;
    }
    else {
LAB_001b3290:
      sVar6 = strlen(pw.pw_name);
      sVar6 = sVar6 + 1;
      sVar3 = strlen(pw.pw_dir);
      sVar3 = sVar3 + 1;
      sVar4 = strlen(pw.pw_shell);
      sVar4 = sVar4 + 1;
      if (pw.pw_gecos == (char *)0x0) {
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(pw.pw_gecos);
        sVar5 = sVar5 + 1;
      }
      __dest = (char *)uv__malloc(sVar4 + sVar5 + sVar3 + sVar6);
      pwd->username = __dest;
      if (__dest == (char *)0x0) {
        uv__free(__buffer);
LAB_001b335b:
        iVar2 = -0xc;
      }
      else {
        memcpy(__dest,pw.pw_name,sVar6);
        pwd->homedir = pwd->username + sVar6;
        memcpy(pwd->username + sVar6,pw.pw_dir,sVar3);
        pwd->shell = pwd->homedir + sVar3;
        memcpy(pwd->homedir + sVar3,pw.pw_shell,sVar4);
        if (pw.pw_gecos == (char *)0x0) {
          pwd->gecos = (char *)0x0;
        }
        else {
          pwd->gecos = pwd->shell + sVar4;
          memcpy(pwd->shell + sVar4,pw.pw_gecos,sVar5);
        }
        auVar1._8_4_ = pw.pw_gid;
        auVar1._0_8_ = pw._16_8_ & 0xffffffff;
        auVar1._12_4_ = 0;
        pwd->uid = pw._16_8_ & 0xffffffff;
        pwd->gid = auVar1._8_8_;
        uv__free(__buffer);
        iVar2 = 0;
      }
    }
  }
  else {
    iVar2 = -iVar2;
  }
  return iVar2;
}

Assistant:

static int uv__getpwuid_r(uv_passwd_t *pwd, uid_t uid) {
  struct passwd pw;
  struct passwd* result;
  char* buf;
  size_t bufsize;
  size_t name_size;
  size_t homedir_size;
  size_t shell_size;
  size_t gecos_size;
  int r;

  if (pwd == NULL)
    return UV_EINVAL;

  /* Calling sysconf(_SC_GETPW_R_SIZE_MAX) would get the suggested size, but it
   * is frequently 1024 or 4096, so we can just use that directly. The pwent
   * will not usually be large. */
  for (bufsize = 2000;; bufsize *= 2) {
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getpwuid_r(uid, &pw, buf, bufsize, &result);
    while (r == EINTR);

    if (r != 0 || result == NULL)
      uv__free(buf);

    if (r != ERANGE)
      break;
  }

  if (r != 0)
    return UV__ERR(r);

  if (result == NULL)
    return UV_ENOENT;

  /* Allocate memory for the username, gecos, shell, and home directory. */
  name_size = strlen(pw.pw_name) + 1;
  homedir_size = strlen(pw.pw_dir) + 1;
  shell_size = strlen(pw.pw_shell) + 1;

#ifdef __MVS__
  gecos_size = 0; /* pw_gecos does not exist on zOS. */
#else
  if (pw.pw_gecos != NULL)
    gecos_size = strlen(pw.pw_gecos) + 1;
  else
    gecos_size = 0;
#endif

  pwd->username = uv__malloc(name_size +
                             homedir_size +
                             shell_size +
                             gecos_size);

  if (pwd->username == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the username */
  memcpy(pwd->username, pw.pw_name, name_size);

  /* Copy the home directory */
  pwd->homedir = pwd->username + name_size;
  memcpy(pwd->homedir, pw.pw_dir, homedir_size);

  /* Copy the shell */
  pwd->shell = pwd->homedir + homedir_size;
  memcpy(pwd->shell, pw.pw_shell, shell_size);

  /* Copy the gecos field */
#ifdef __MVS__
  pwd->gecos = NULL;  /* pw_gecos does not exist on zOS. */
#else
  if (pw.pw_gecos == NULL) {
    pwd->gecos = NULL;
  } else {
    pwd->gecos = pwd->shell + shell_size;
    memcpy(pwd->gecos, pw.pw_gecos, gecos_size);
  }
#endif

  /* Copy the uid and gid */
  pwd->uid = pw.pw_uid;
  pwd->gid = pw.pw_gid;

  uv__free(buf);

  return 0;
}